

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_resolv_blocking
                   (Curl_easy *data,char *hostname,int port,int ip_version,Curl_dns_entry **dnsentry
                   )

{
  CURLcode CVar1;
  CURLcode CVar2;
  
  *dnsentry = (Curl_dns_entry *)0x0;
  CVar1 = Curl_resolv(data,hostname,port,ip_version,false,dnsentry);
  if (CVar1 == CURLE_AGAIN) {
    CVar2 = Curl_async_await(data,dnsentry);
    if ((CVar2 != CURLE_OK) || (CVar1 = CURLE_OK, *dnsentry == (Curl_dns_entry *)0x0)) {
      Curl_conncontrol(data->conn,1);
      CVar1 = CVar2;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_resolv_blocking(struct Curl_easy *data,
                              const char *hostname,
                              int port,
                              int ip_version,
                              struct Curl_dns_entry **dnsentry)
{
  CURLcode result;

  *dnsentry = NULL;
  result = Curl_resolv(data, hostname, port, ip_version, FALSE, dnsentry);
  switch(result) {
  case CURLE_OK:
    DEBUGASSERT(*dnsentry);
    return CURLE_OK;
  case CURLE_AGAIN:
    DEBUGASSERT(!*dnsentry);
    result = Curl_async_await(data, dnsentry);
    if(result || !*dnsentry) {
      /* close the connection, since we cannot return failure here without
         cleaning up this connection properly. */
      connclose(data->conn, "async resolve failed");
    }
    return result;
  default:
    return result;
  }
}